

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O0

int t3_compare_case_fold(wchar_t *a,size_t alen,char *b,size_t blen,size_t *bmatchlen)

{
  int iVar1;
  char *pcVar2;
  long in_RDX;
  long *in_R8;
  bool bVar3;
  wchar_t bch;
  wchar_t ach;
  Utf8FoldStr bp;
  CVmCaseFoldStr ap;
  wchar_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  wchar_t in_stack_ffffffffffffff78;
  wchar_t in_stack_ffffffffffffff7c;
  Utf8FoldStr *in_stack_ffffffffffffff80;
  CVmCaseFoldStr local_58;
  long *local_30;
  long local_20;
  
  local_30 = in_R8;
  local_20 = in_RDX;
  CVmCaseFoldStr::CVmCaseFoldStr
            ((CVmCaseFoldStr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,0x247a70);
  Utf8FoldStr::Utf8FoldStr
            (in_stack_ffffffffffffff80,
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  while( true ) {
    iVar1 = CVmCaseFoldStr::more(&local_58);
    bVar3 = false;
    if (iVar1 != 0) {
      iVar1 = Utf8FoldStr::more((Utf8FoldStr *)&stack0xffffffffffffff80);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    in_stack_ffffffffffffff7c =
         CVmCaseFoldStr::getch
                   ((CVmCaseFoldStr *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    in_stack_ffffffffffffff78 =
         Utf8FoldStr::getch((Utf8FoldStr *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_stack_ffffffffffffff7c != in_stack_ffffffffffffff78) {
      return in_stack_ffffffffffffff7c - in_stack_ffffffffffffff78;
    }
  }
  if (((local_30 != (long *)0x0) && (iVar1 = CVmCaseFoldStr::more(&local_58), iVar1 == 0)) &&
     (iVar1 = Utf8FoldStr::at_boundary((Utf8FoldStr *)&stack0xffffffffffffff80), iVar1 != 0)) {
    pcVar2 = Utf8FoldStr::getptr((Utf8FoldStr *)0x247b25);
    *local_30 = (long)pcVar2 - local_20;
    return 0;
  }
  iVar1 = CVmCaseFoldStr::more(&local_58);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = Utf8FoldStr::more((Utf8FoldStr *)&stack0xffffffffffffff80);
  if (iVar1 == 0) {
    return 0;
  }
  return -1;
}

Assistant:

int t3_compare_case_fold(
    const wchar_t *a, size_t alen,
    const char *b, size_t blen, size_t *bmatchlen)
{
    /* set up folded-case string readers for the two strings */
    CVmCaseFoldStr ap(a, alen);
    Utf8FoldStr bp(b, blen);

    /* scan until we find a mismatch or run out of one string */
    while (ap.more() && bp.more())
    {
        /* get the next character of each string */
        wchar_t ach = ap.getch(), bch = bp.getch();

        /* if they're different, return the sign difference */
        if (ach != bch)
            return ach - bch;
    }

    /* 
     *   if 'a' ran out first, and we have a 'bmatchlen' pointer, then we're
     *   being asked if 'a' is a leading substring of 'b', which it is - fill
     *   in '*bmatchlen' with the length of 'b' that we matched, and return
     *   ture 
     */
    if (bmatchlen != 0 && !ap.more() && bp.at_boundary())
    {
        *bmatchlen = bp.getptr() - b;
        return 0;
    }

    /* which ran out first was shorter, so sorts first */
    return ap.more() ? 1 : bp.more() ? -1 : 0;
}